

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGhostObject.cpp
# Opt level: O3

void __thiscall
cbtPairCachingGhostObject::removeOverlappingObjectInternal
          (cbtPairCachingGhostObject *this,cbtBroadphaseProxy *otherProxy,cbtDispatcher *dispatcher,
          cbtBroadphaseProxy *thisProxy1)

{
  int iVar1;
  cbtCollisionObject **ppcVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar3;
  long lVar4;
  
  if (thisProxy1 == (cbtBroadphaseProxy *)0x0) {
    thisProxy1 = (this->super_cbtGhostObject).super_cbtCollisionObject.m_broadphaseHandle;
  }
  iVar1 = (this->super_cbtGhostObject).m_overlappingObjects.m_size;
  lVar3 = (long)iVar1;
  if (0 < lVar3) {
    ppcVar2 = (this->super_cbtGhostObject).m_overlappingObjects.m_data;
    lVar4 = 0;
    do {
      if (ppcVar2[lVar4] == (cbtCollisionObject *)otherProxy->m_clientObject) {
        if (iVar1 <= (int)lVar4) {
          return;
        }
        ppcVar2[lVar4] = ppcVar2[lVar3 + -1];
        (this->super_cbtGhostObject).m_overlappingObjects.m_size = iVar1 + -1;
        UNRECOVERED_JUMPTABLE =
             (this->m_hashPairCache->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback
             ._vptr_cbtOverlappingPairCallback[3];
        (*UNRECOVERED_JUMPTABLE)
                  (this->m_hashPairCache,thisProxy1,otherProxy,dispatcher,UNRECOVERED_JUMPTABLE);
        return;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return;
}

Assistant:

void cbtPairCachingGhostObject::removeOverlappingObjectInternal(cbtBroadphaseProxy* otherProxy, cbtDispatcher* dispatcher, cbtBroadphaseProxy* thisProxy1)
{
	cbtCollisionObject* otherObject = (cbtCollisionObject*)otherProxy->m_clientObject;
	cbtBroadphaseProxy* actualThisProxy = thisProxy1 ? thisProxy1 : getBroadphaseHandle();
	cbtAssert(actualThisProxy);

	cbtAssert(otherObject);
	int index = m_overlappingObjects.findLinearSearch(otherObject);
	if (index < m_overlappingObjects.size())
	{
		m_overlappingObjects[index] = m_overlappingObjects[m_overlappingObjects.size() - 1];
		m_overlappingObjects.pop_back();
		m_hashPairCache->removeOverlappingPair(actualThisProxy, otherProxy, dispatcher);
	}
}